

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall
cmake::SetArgs(cmake *this,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *args,bool directoriesSetBefore)

{
  pointer pbVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  ostream *poVar8;
  cmGlobalGenerator *gg;
  bool collapse;
  ulong extraout_RDX;
  uint uVar9;
  ulong uVar10;
  string value;
  string arg;
  string local_50;
  
  uVar7 = (ulong)directoriesSetBefore;
  uVar9 = 1;
  bVar4 = false;
  bVar3 = false;
  do {
    uVar10 = (ulong)uVar9;
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar10) {
      if ((directoriesSetBefore & 1U) != 0) {
        return;
      }
      cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
                (&arg,(SystemTools *)0x1,SUB81(uVar7,0));
      SetHomeOutputDirectory(this,&arg);
      std::__cxx11::string::~string((string *)&arg);
      cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&arg,(SystemTools *)0x1,collapse);
      SetHomeDirectory(this,&arg);
      std::__cxx11::string::~string((string *)&arg);
      return;
    }
    std::__cxx11::string::string((string *)&arg,(string *)(pbVar1 + uVar10));
    lVar6 = std::__cxx11::string::find((char *)&arg,0x46ac22);
    if (lVar6 == 0) {
      std::__cxx11::string::substr((ulong)&value,(ulong)&arg);
      cmsys::SystemTools::CollapseFullPath(&local_50,&value);
      std::__cxx11::string::operator=((string *)&value,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      cmsys::SystemTools::ConvertToUnixSlashes(&value);
      SetHomeDirectory(this,&value);
LAB_00276f87:
      std::__cxx11::string::~string((string *)&value);
      directoriesSetBefore = true;
LAB_00276f95:
      bVar2 = true;
    }
    else {
      lVar6 = std::__cxx11::string::find((char *)&arg,0x467caf);
      if ((lVar6 == 0) || (lVar6 = std::__cxx11::string::find((char *)&arg,0x467cb2), lVar6 == 0))
      goto LAB_00276f95;
      lVar6 = std::__cxx11::string::find((char *)&arg,0x46ac26);
      if (lVar6 == 0) {
        std::__cxx11::string::substr((ulong)&value,(ulong)&arg);
        cmsys::SystemTools::CollapseFullPath(&local_50,&value);
        std::__cxx11::string::operator=((string *)&value,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        cmsys::SystemTools::ConvertToUnixSlashes(&value);
        SetHomeOutputDirectory(this,&value);
        goto LAB_00276f87;
      }
      lVar6 = (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5;
      if (uVar10 < lVar6 - 2U) {
        lVar6 = std::__cxx11::string::find((char *)&arg,0x467cb5);
        if (lVar6 == 0) {
          std::__cxx11::string::_M_assign((string *)&this->CheckBuildSystemArgument);
          uVar9 = uVar9 + 2;
          iVar5 = atoi((args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[uVar9]._M_dataplus._M_p);
          this->ClearBuildSystem = 0 < iVar5;
          goto LAB_00276f95;
        }
        lVar6 = (long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5;
      }
      uVar7 = lVar6 - 1;
      if (uVar10 < uVar7) {
        lVar6 = std::__cxx11::string::find((char *)&arg,0x467cca);
        if (lVar6 == 0) {
          uVar9 = uVar9 + 1;
          std::__cxx11::string::_M_assign((string *)&this->CheckStampFile);
          goto LAB_00276f95;
        }
        uVar7 = ((long)(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 5) - 1;
      }
      if ((uVar10 < uVar7) &&
         (lVar6 = std::__cxx11::string::find((char *)&arg,0x467cdd), lVar6 == 0)) {
        uVar9 = uVar9 + 1;
        std::__cxx11::string::_M_assign((string *)&this->CheckStampList);
        goto LAB_00276f95;
      }
      lVar6 = std::__cxx11::string::find((char *)&arg,0x467cf0);
      if (lVar6 == 0) {
        this->Verbose = true;
        goto LAB_00276f95;
      }
      lVar6 = std::__cxx11::string::find((char *)&arg,0x47b977);
      if (((lVar6 == 0) || (lVar6 = std::__cxx11::string::find((char *)&arg,0x467b4e), lVar6 == 0))
         || (lVar6 = std::__cxx11::string::find((char *)&arg,0x467b6f), lVar6 == 0))
      goto LAB_00276f95;
      lVar6 = std::__cxx11::string::find((char *)&arg,0x467bb2);
      if ((lVar6 == 0) || (lVar6 = std::__cxx11::string::find((char *)&arg,0x467bd9), lVar6 == 0)) {
        uVar9 = uVar9 + 1;
        goto LAB_00276f95;
      }
      lVar6 = std::__cxx11::string::find((char *)&arg,0x465739);
      if ((lVar6 == 0) || (lVar6 = std::__cxx11::string::find((char *)&arg,0x46575f), lVar6 == 0))
      goto LAB_00276f95;
      lVar6 = std::__cxx11::string::find((char *)&arg,0x467cf3);
      if (lVar6 == 0) {
        std::__cxx11::string::substr((ulong)&value,(ulong)&arg);
        cmsys::SystemTools::CollapseFullPath(&local_50,&value);
        std::__cxx11::string::operator=((string *)&value,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        cmsys::SystemTools::ConvertToUnixSlashes(&value);
        std::__cxx11::string::_M_assign((string *)&this->GraphVizFile);
        if ((this->GraphVizFile)._M_string_length == 0) {
          cmSystemTools::Error
                    ("No file specified for --graphviz",(char *)0x0,(char *)0x0,(char *)0x0);
        }
        std::__cxx11::string::~string((string *)&value);
        goto LAB_00276f95;
      }
      lVar6 = std::__cxx11::string::find((char *)&arg,0x467d20);
      if (lVar6 == 0) {
        std::operator<<((ostream *)&std::cout,"debug trycompile on\n");
        this->DebugTryCompile = true;
        goto LAB_00276f95;
      }
      lVar6 = std::__cxx11::string::find((char *)&arg,0x467d48);
      if (lVar6 == 0) {
        std::operator<<((ostream *)&std::cout,"Running with debug output on.\n");
        this->DebugOutput = true;
        goto LAB_00276f95;
      }
      lVar6 = std::__cxx11::string::find((char *)&arg,0x467d76);
      if (lVar6 == 0) {
        std::operator<<((ostream *)&std::cout,"Running with trace output on.\n");
        this->Trace = true;
        goto LAB_00276f95;
      }
      lVar6 = std::__cxx11::string::find((char *)&arg,0x467d9d);
      if (lVar6 == 0) {
        std::operator<<((ostream *)&std::cout,"Warn about uninitialized values.\n");
        this->WarnUninitialized = true;
        goto LAB_00276f95;
      }
      lVar6 = std::__cxx11::string::find((char *)&arg,0x467dd4);
      if (lVar6 == 0) {
        std::operator<<((ostream *)&std::cout,"Finding unused variables.\n");
        this->WarnUnused = true;
        goto LAB_00276f95;
      }
      lVar6 = std::__cxx11::string::find((char *)&arg,0x467e02);
      if (lVar6 == 0) {
        poVar8 = std::operator<<((ostream *)&std::cout,
                                 "Not searching for unused variables given on the ");
        std::operator<<(poVar8,"command line.\n");
        this->WarnUnusedCli = false;
        goto LAB_00276f95;
      }
      lVar6 = std::__cxx11::string::find((char *)&arg,0x467e57);
      if (lVar6 == 0) {
        poVar8 = std::operator<<((ostream *)&std::cout,
                                 "Also check system files when warning about unused and ");
        std::operator<<(poVar8,"uninitialized variables.\n");
        this->CheckSystemVars = true;
        goto LAB_00276f95;
      }
      lVar6 = std::__cxx11::string::find((char *)&arg,0x467ed6);
      if (lVar6 == 0) {
        std::__cxx11::string::substr((ulong)&value,(ulong)&arg);
        if (value._M_string_length == 0) {
          uVar9 = uVar9 + 1;
          if ((ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5) <= (ulong)uVar9) {
            bVar2 = false;
            cmSystemTools::Error("No platform specified for -A",(char *)0x0,(char *)0x0,(char *)0x0)
            ;
            goto LAB_002773b3;
          }
          std::__cxx11::string::_M_assign((string *)&value);
        }
        if (bVar3) {
          bVar2 = false;
          cmSystemTools::Error
                    ("Multiple -A options not allowed",(char *)0x0,(char *)0x0,(char *)0x0);
          bVar3 = true;
        }
        else {
          bVar3 = true;
          std::__cxx11::string::_M_assign((string *)&this->GeneratorPlatform);
          bVar2 = true;
        }
LAB_002773b3:
        std::__cxx11::string::~string((string *)&value);
        if (bVar2) goto LAB_00276f95;
      }
      else {
        lVar6 = std::__cxx11::string::find((char *)&arg,0x467f12);
        if (lVar6 == 0) {
          std::__cxx11::string::substr((ulong)&value,(ulong)&arg);
          if (value._M_string_length == 0) {
            uVar9 = uVar9 + 1;
            if ((ulong)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5) <= (ulong)uVar9) {
              bVar2 = false;
              cmSystemTools::Error
                        ("No toolset specified for -T",(char *)0x0,(char *)0x0,(char *)0x0);
              goto LAB_002773b3;
            }
            std::__cxx11::string::_M_assign((string *)&value);
          }
          if (bVar4) {
            bVar2 = false;
            cmSystemTools::Error
                      ("Multiple -T options not allowed",(char *)0x0,(char *)0x0,(char *)0x0);
            bVar4 = true;
          }
          else {
            bVar4 = true;
            std::__cxx11::string::_M_assign((string *)&this->GeneratorToolset);
            bVar2 = true;
          }
          goto LAB_002773b3;
        }
        lVar6 = std::__cxx11::string::find((char *)&arg,0x467f50);
        if (lVar6 != 0) {
          directoriesSetBefore = true;
          SetDirectoriesFromFile(this,arg._M_dataplus._M_p);
          goto LAB_00276f95;
        }
        std::__cxx11::string::substr((ulong)&value,(ulong)&arg);
        if (value._M_string_length == 0) {
          uVar9 = uVar9 + 1;
          if ((ulong)uVar9 <
              (ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5)) {
            std::__cxx11::string::_M_assign((string *)&value);
            goto LAB_00277329;
          }
          cmSystemTools::Error("No generator specified for -G",(char *)0x0,(char *)0x0,(char *)0x0);
          PrintGeneratorList(this);
          bVar2 = false;
        }
        else {
LAB_00277329:
          gg = CreateGlobalGenerator(this,&value);
          if (gg == (cmGlobalGenerator *)0x0) {
            cmSystemTools::Error
                      ("Could not create named generator ",value._M_dataplus._M_p,(char *)0x0,
                       (char *)0x0);
            bVar2 = true;
            PrintGeneratorList(this);
          }
          else {
            bVar2 = true;
            SetGlobalGenerator(this,gg);
          }
        }
        std::__cxx11::string::~string((string *)&value);
        if (bVar2) goto LAB_00276f95;
      }
      bVar2 = false;
    }
    std::__cxx11::string::~string((string *)&arg);
    uVar9 = uVar9 + 1;
    uVar7 = extraout_RDX;
    if (!bVar2) {
      return;
    }
  } while( true );
}

Assistant:

void cmake::SetArgs(const std::vector<std::string>& args,
                    bool directoriesSetBefore)
{
  bool directoriesSet = directoriesSetBefore;
  bool haveToolset = false;
  bool havePlatform = false;
  for(unsigned int i=1; i < args.size(); ++i)
    {
    std::string arg = args[i];
    if(arg.find("-H",0) == 0)
      {
      directoriesSet = true;
      std::string path = arg.substr(2);
      path = cmSystemTools::CollapseFullPath(path);
      cmSystemTools::ConvertToUnixSlashes(path);
      this->SetHomeDirectory(path);
      }
    else if(arg.find("-S",0) == 0)
      {
      // There is no local generate anymore.  Ignore -S option.
      }
    else if(arg.find("-O",0) == 0)
      {
      // There is no local generate anymore.  Ignore -O option.
      }
    else if(arg.find("-B",0) == 0)
      {
      directoriesSet = true;
      std::string path = arg.substr(2);
      path = cmSystemTools::CollapseFullPath(path);
      cmSystemTools::ConvertToUnixSlashes(path);
      this->SetHomeOutputDirectory(path);
      }
    else if((i < args.size()-2) && (arg.find("--check-build-system",0) == 0))
      {
      this->CheckBuildSystemArgument = args[++i];
      this->ClearBuildSystem = (atoi(args[++i].c_str()) > 0);
      }
    else if((i < args.size()-1) && (arg.find("--check-stamp-file",0) == 0))
      {
      this->CheckStampFile = args[++i];
      }
    else if((i < args.size()-1) && (arg.find("--check-stamp-list",0) == 0))
      {
      this->CheckStampList = args[++i];
      }
#if defined(CMAKE_HAVE_VS_GENERATORS)
    else if((i < args.size()-1) && (arg.find("--vs-solution-file",0) == 0))
      {
      this->VSSolutionFile = args[++i];
      }
#endif
    else if(arg.find("-V",0) == 0)
      {
        this->Verbose = true;
      }
    else if(arg.find("-D",0) == 0)
      {
      // skip for now
      }
    else if(arg.find("-U",0) == 0)
      {
      // skip for now
      }
    else if(arg.find("-C",0) == 0)
      {
      // skip for now
      }
    else if(arg.find("-P",0) == 0)
      {
      // skip for now
      i++;
      }
    else if(arg.find("--find-package",0) == 0)
      {
      // skip for now
      i++;
      }
    else if(arg.find("-Wno-dev",0) == 0)
      {
      // skip for now
      }
    else if(arg.find("-Wdev",0) == 0)
      {
      // skip for now
      }
    else if(arg.find("--graphviz=",0) == 0)
      {
      std::string path = arg.substr(strlen("--graphviz="));
      path = cmSystemTools::CollapseFullPath(path);
      cmSystemTools::ConvertToUnixSlashes(path);
      this->GraphVizFile = path;
      if ( this->GraphVizFile.empty() )
        {
        cmSystemTools::Error("No file specified for --graphviz");
        }
      }
    else if(arg.find("--debug-trycompile",0) == 0)
      {
      std::cout << "debug trycompile on\n";
      this->DebugTryCompileOn();
      }
    else if(arg.find("--debug-output",0) == 0)
      {
      std::cout << "Running with debug output on.\n";
      this->SetDebugOutputOn(true);
      }
    else if(arg.find("--trace",0) == 0)
      {
      std::cout << "Running with trace output on.\n";
      this->SetTrace(true);
      }
    else if(arg.find("--warn-uninitialized",0) == 0)
      {
      std::cout << "Warn about uninitialized values.\n";
      this->SetWarnUninitialized(true);
      }
    else if(arg.find("--warn-unused-vars",0) == 0)
      {
      std::cout << "Finding unused variables.\n";
      this->SetWarnUnused(true);
      }
    else if(arg.find("--no-warn-unused-cli",0) == 0)
      {
      std::cout << "Not searching for unused variables given on the " <<
                   "command line.\n";
      this->SetWarnUnusedCli(false);
      }
    else if(arg.find("--check-system-vars",0) == 0)
      {
      std::cout << "Also check system files when warning about unused and " <<
                   "uninitialized variables.\n";
      this->SetCheckSystemVars(true);
      }
    else if(arg.find("-A",0) == 0)
      {
      std::string value = arg.substr(2);
      if(value.empty())
        {
        ++i;
        if(i >= args.size())
          {
          cmSystemTools::Error("No platform specified for -A");
          return;
          }
        value = args[i];
        }
      if(havePlatform)
        {
        cmSystemTools::Error("Multiple -A options not allowed");
        return;
        }
      this->GeneratorPlatform = value;
      havePlatform = true;
      }
    else if(arg.find("-T",0) == 0)
      {
      std::string value = arg.substr(2);
      if(value.empty())
        {
        ++i;
        if(i >= args.size())
          {
          cmSystemTools::Error("No toolset specified for -T");
          return;
          }
        value = args[i];
        }
      if(haveToolset)
        {
        cmSystemTools::Error("Multiple -T options not allowed");
        return;
        }
      this->GeneratorToolset = value;
      haveToolset = true;
      }
    else if(arg.find("-G",0) == 0)
      {
      std::string value = arg.substr(2);
      if(value.empty())
        {
        ++i;
        if(i >= args.size())
          {
          cmSystemTools::Error("No generator specified for -G");
          this->PrintGeneratorList();
          return;
          }
        value = args[i];
        }
      cmGlobalGenerator* gen =
        this->CreateGlobalGenerator(value);
      if(!gen)
        {
        cmSystemTools::Error("Could not create named generator ",
                             value.c_str());
        this->PrintGeneratorList();
        }
      else
        {
        this->SetGlobalGenerator(gen);
        }
      }
    // no option assume it is the path to the source
    else
      {
      directoriesSet = true;
      this->SetDirectoriesFromFile(arg.c_str());
      }
    }